

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_group(CHAR_DATA *ch,char *argument)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  MOB_INDEX_DATA *args;
  char **args_2;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*> *args_3;
  CClass *pCVar4;
  char *pcVar5;
  CHAR_DATA *pCVar6;
  CHAR_DATA *this;
  CHAR_DATA *in_RDI;
  CHAR_DATA *vch;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  int exp_ltl;
  int epl;
  int exp_tnl;
  CHAR_DATA *gch;
  CHAR_DATA *leader;
  char buf2 [4608];
  string buffer;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffd8d8;
  CHAR_DATA *in_stack_ffffffffffffd8e0;
  CHAR_DATA *in_stack_ffffffffffffd8e8;
  char_data *in_stack_ffffffffffffd8f0;
  undefined4 in_stack_ffffffffffffd8f8;
  undefined4 in_stack_ffffffffffffd8fc;
  undefined4 in_stack_ffffffffffffd900;
  undefined4 in_stack_ffffffffffffd904;
  int local_26e4;
  int local_26e0;
  int local_26dc;
  int local_26d8;
  int local_26d4;
  char *in_stack_ffffffffffffd950;
  short *in_stack_ffffffffffffd958;
  undefined4 in_stack_ffffffffffffd960;
  int in_stack_ffffffffffffd964;
  int in_stack_ffffffffffffd968;
  int in_stack_ffffffffffffd96c;
  int in_stack_ffffffffffffd970;
  undefined2 in_stack_ffffffffffffd974;
  MOB_INDEX_DATA **args_1;
  CHAR_DATA *local_2648;
  int *in_stack_ffffffffffffda20;
  int *in_stack_ffffffffffffda28;
  undefined4 in_stack_ffffffffffffda30;
  int in_stack_ffffffffffffda34;
  string local_25c0 [32];
  int local_25a0;
  int local_259c;
  int local_2598;
  int local_2594;
  CHAR_DATA *local_2590;
  CHAR_DATA *local_2588;
  string local_2580 [36];
  int local_255c;
  int local_2558;
  int local_2554;
  CHAR_DATA *local_2550;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_2548;
  MEM_DATA *local_2530;
  MOB_INDEX_DATA *local_2528;
  string local_2520 [32];
  CHAR_DATA *local_2500;
  char local_24f8 [56];
  format_args in_stack_ffffffffffffdb40;
  string_view in_stack_ffffffffffffdb50;
  char *in_stack_ffffffffffffeae0;
  CHAR_DATA *in_stack_ffffffffffffeae8;
  string local_12f8 [32];
  char local_12d8;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  void *in_stack_fffffffffffffe18;
  void *in_stack_fffffffffffffe20;
  CHAR_DATA *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*> *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*> **local_a8;
  MEM_DATA *local_a0;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_90;
  MEM_DATA *local_88;
  MOB_INDEX_DATA *pMStack_80;
  string *local_78;
  char *local_70;
  MEM_DATA **local_68;
  char *local_60;
  MEM_DATA **local_58;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*> **local_50;
  undefined8 *local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*> **local_40;
  undefined8 local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*> **local_28;
  MEM_DATA **local_20;
  MEM_DATA *local_18;
  char *local_8;
  
  one_argument((char *)in_stack_ffffffffffffd8e0,(char *)in_stack_ffffffffffffd8d8);
  if (local_12d8 == '\0') {
    std::__cxx11::string::string(local_12f8);
    pCVar6 = in_RDI;
    if (in_RDI->leader != (CHAR_DATA *)0x0) {
      pCVar6 = in_RDI->leader;
    }
    local_68 = &local_2530;
    local_70 = "{}\'s group:\n\r";
    local_60 = "{}\'s group:\n\r";
    local_2530 = (MEM_DATA *)0x7be384;
    args_1 = &local_2528;
    local_2500 = pCVar6;
    local_58 = local_68;
    args = (MOB_INDEX_DATA *)std::char_traits<char>::length((char_type *)0x52b37a);
    *args_1 = args;
    local_8 = local_70;
    this = in_RDI;
    args_2 = (char **)pers(in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
    local_78 = local_2520;
    local_88 = local_2530;
    pMStack_80 = local_2528;
    local_90 = &local_2548;
    local_20 = &local_88;
    local_a0 = local_2530;
    local_2548.long_long_value = (longlong)args_2;
    local_18 = local_a0;
    args_3 = fmt::v9::make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&>
                       ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*>
                         *)&local_90->string,(v9 *)this,(char **)local_78);
    local_48 = &local_b0;
    local_50 = local_c8;
    local_38 = 0xc;
    local_b0 = 0xc;
    local_c8[0] = args_3;
    local_40 = local_50;
    local_30 = local_48;
    local_28 = local_50;
    local_a8 = local_50;
    fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb40);
    std::__cxx11::string::operator=(local_12f8,local_2520);
    std::__cxx11::string::~string(local_2520);
    std::__cxx11::string::c_str();
    send_to_char((char *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
    for (local_2550 = char_list; local_2550 != (CHAR_DATA *)0x0; local_2550 = local_2550->next) {
      uVar1 = is_same_group(local_2550,in_RDI);
      if ((bool)uVar1) {
        uVar2 = is_npc(in_stack_ffffffffffffd8d8);
        if ((bool)uVar2) {
          pcVar5 = pers(in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          sprintf(local_24f8,"%s",pcVar5);
          if (((local_24f8[0] != '\0') && ('`' < local_24f8[0])) && (local_24f8[0] < '{')) {
            local_24f8[0] = local_24f8[0] + -0x20;
          }
          if (local_2550->max_move == 0) {
            in_stack_ffffffffffffda34 = 0;
          }
          else {
            in_stack_ffffffffffffda34 = (local_2550->move * 100) / (int)local_2550->max_move;
          }
          fmt::v9::sprintf<char[43],char[4608],int,int,int,char>
                    ((char (*) [43])
                     CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffd974,
                                                            in_stack_ffffffffffffd970))),
                     (char (*) [4608])CONCAT44(in_stack_ffffffffffffd96c,in_stack_ffffffffffffd968),
                     (int *)CONCAT44(in_stack_ffffffffffffd964,in_stack_ffffffffffffd960),
                     (int *)in_stack_ffffffffffffd958,(int *)in_stack_ffffffffffffd950);
          std::__cxx11::string::operator=(local_12f8,local_25c0);
          std::__cxx11::string::~string(local_25c0);
        }
        else {
          in_stack_ffffffffffffd96c = (int)local_2550->level;
          in_stack_ffffffffffffd970 = exp_per_level(in_stack_ffffffffffffd8d8);
          local_2554 = in_stack_ffffffffffffd96c * in_stack_ffffffffffffd970 - local_2550->exp;
          local_2558 = pc_race_table[local_2550->race].xpadd + 0x5dc;
          local_2558 = local_2558 + (int)((double)((local_2550->level + -2) * local_2558) * 0.08);
          in_stack_ffffffffffffd964 = (int)local_2550->level;
          in_stack_ffffffffffffd968 = exp_per_level(in_stack_ffffffffffffd8d8);
          local_255c = in_stack_ffffffffffffd964 * in_stack_ffffffffffffd968 -
                       (local_2550->level + -1) * local_2558;
          in_stack_ffffffffffffd958 = &local_2550->level;
          bVar3 = is_npc(in_stack_ffffffffffffd8d8);
          in_stack_ffffffffffffd960 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffd960);
          if (bVar3) {
            in_stack_ffffffffffffd950 = "Mob";
          }
          else {
            pCVar4 = char_data::Class(in_stack_ffffffffffffd8f0);
            in_stack_ffffffffffffd950 = RString::operator_cast_to_char_(&pCVar4->who_name);
          }
          local_2588 = (CHAR_DATA *)in_stack_ffffffffffffd950;
          pcVar5 = pers(in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          local_2590 = (CHAR_DATA *)capitalize(pcVar5);
          if (local_2550->max_hit == 0) {
            local_26d4 = 0;
          }
          else {
            local_26d4 = (local_2550->hit * 100) / (int)local_2550->max_hit;
          }
          local_2594 = local_26d4;
          if (local_2550->max_mana == 0) {
            local_26d8 = 0;
          }
          else {
            local_26d8 = (local_2550->mana * 100) / (int)local_2550->max_mana;
          }
          local_2598 = local_26d8;
          if (local_2550->max_move == 0) {
            local_26dc = 0;
          }
          else {
            local_26dc = (local_2550->move * 100) / (int)local_2550->max_move;
          }
          local_259c = local_26dc;
          if ((local_2554 * 100) / local_255c < 0) {
            local_26e0 = 0;
          }
          else {
            if ((local_2554 * 100) / local_255c < 0x65) {
              local_26e4 = (local_2554 * 100) / local_255c;
            }
            else {
              local_26e4 = 100;
            }
            local_26e0 = local_26e4;
          }
          local_25a0 = local_26e0;
          in_stack_ffffffffffffd8e8 = (CHAR_DATA *)&local_25a0;
          in_stack_ffffffffffffd8e0 = (CHAR_DATA *)&local_259c;
          in_stack_ffffffffffffd8d8 = (CHAR_DATA *)&local_2598;
          fmt::v9::sprintf<char[52],short,char_const*,char*,int,int,int,int,char>
                    ((char (*) [52])pCVar6,(short *)args,(char **)args_1,args_2,(int *)args_3,
                     in_stack_ffffffffffffda20,in_stack_ffffffffffffda28,
                     (int *)CONCAT44(in_stack_ffffffffffffda34,in_stack_ffffffffffffda30));
          std::__cxx11::string::operator=(local_12f8,local_2580);
          std::__cxx11::string::~string(local_2580);
        }
        std::__cxx11::string::c_str();
        send_to_char((char *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
      }
    }
    std::__cxx11::string::~string(local_12f8);
  }
  else {
    pCVar6 = get_char_room(in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0);
    if (pCVar6 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
    }
    else if ((in_RDI->master == (CHAR_DATA *)0x0) &&
            ((in_RDI->leader == (CHAR_DATA *)0x0 || (in_RDI->leader == in_RDI)))) {
      if ((pCVar6->master == in_RDI) || (in_RDI == pCVar6)) {
        bVar3 = is_affected_by(in_stack_ffffffffffffd8e8,
                               (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20));
        if (bVar3) {
          send_to_char((char *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
        }
        else {
          bVar3 = is_affected_by(in_stack_ffffffffffffd8e8,
                                 (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20));
          if (bVar3) {
            act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
          }
          else {
            bVar3 = is_same_group(pCVar6,in_RDI);
            if ((bVar3) && (in_RDI != pCVar6)) {
              pCVar6->leader = (CHAR_DATA *)0x0;
              act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
              ;
              act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
              ;
              act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
              ;
              check_leadership_affect(in_stack_ffffffffffffd8e0);
            }
            else {
              pCVar6->leader = in_RDI;
              act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
              ;
              act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
              ;
              act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
              ;
              bVar3 = is_npc(in_stack_ffffffffffffd8d8);
              if ((!bVar3) && (bVar3 = is_npc(in_stack_ffffffffffffd8d8), !bVar3)) {
                char_data::Class(in_stack_ffffffffffffd8f0);
                bVar3 = RString::operator==((RString *)in_stack_ffffffffffffd8e0,
                                            (char *)in_stack_ffffffffffffd8d8);
                if ((bVar3) && (1 < in_RDI->pcdata->learned[gsn_traitors_luck])) {
                  init_affect((AFFECT_DATA *)0x52bf51);
                  std::pow<int,int>(0,0x52bfb8);
                  new_affect_to_char((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffd904,in_stack_ffffffffffffd900),
                                     (AFFECT_DATA *)
                                     CONCAT44(in_stack_ffffffffffffd8fc,in_stack_ffffffffffffd8f8));
                }
              }
              bVar3 = is_npc(in_stack_ffffffffffffd8d8);
              if ((!bVar3) && (bVar3 = is_npc(in_stack_ffffffffffffd8d8), !bVar3)) {
                char_data::Class(in_stack_ffffffffffffd8f0);
                bVar3 = RString::operator==((RString *)in_stack_ffffffffffffd8e0,
                                            (char *)in_stack_ffffffffffffd8d8);
                if ((bVar3) && (1 < pCVar6->pcdata->learned[gsn_traitors_luck])) {
                  init_affect((AFFECT_DATA *)0x52c090);
                  std::pow<int,int>(0,0x52c0f7);
                  for (local_2648 = char_list; local_2648 != (CHAR_DATA *)0x0;
                      local_2648 = local_2648->next) {
                    if ((local_2648 != in_RDI) && (bVar3 = is_same_group(local_2648,in_RDI), bVar3))
                    {
                      new_affect_to_char((CHAR_DATA *)
                                         CONCAT44(in_stack_ffffffffffffd904,
                                                  in_stack_ffffffffffffd900),
                                         (AFFECT_DATA *)
                                         CONCAT44(in_stack_ffffffffffffd8fc,
                                                  in_stack_ffffffffffffd8f8));
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        act_new(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
    }
  }
  return;
}

Assistant:

void do_group(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		std::string buffer;
		char buf2[MAX_STRING_LENGTH];
		auto leader = ch->leader != nullptr ? ch->leader : ch;

		buffer = fmt::format("{}'s group:\n\r", pers(leader, ch));
		send_to_char(buffer.c_str(), ch);

		for (auto gch = char_list; gch != nullptr; gch = gch->next)
		{
			if (is_same_group(gch, ch))
			{
				if (!is_npc(gch))
				{
					auto exp_tnl = (gch->level * exp_per_level(gch) - gch->exp);
					auto epl = pc_race_table[gch->race].xpadd + 1500;
					epl += (int)((gch->level - 2) * epl * 0.08);
					auto exp_ltl = (gch->level * exp_per_level(gch) - (gch->level - 1) * epl);
					buffer = fmt::sprintf("[%2d %s] %-32s %3d%%hp %3d%%mana %3d%%mv %3d%%tnl\n\r",
							gch->level,
							is_npc(gch) ? "Mob" : gch->Class()->who_name,
							capitalize(pers(gch, ch)),
							(gch->max_hit == 0) ? 0 : (gch->hit * 100) / gch->max_hit,
							(gch->max_mana == 0) ? 0 : (gch->mana * 100) / gch->max_mana,
							(gch->max_move == 0) ? 0 : (gch->move * 100) / gch->max_move,
							URANGE(0, (exp_tnl * 100) / exp_ltl, 100));
				}
				else
				{
					sprintf(buf2, "%s", pers(gch, ch));
					if (buf2[0] != '\0')
						buf2[0] = UPPER(buf2[0]);

					buffer = fmt::sprintf("[Minion] %-32s %3d%%hp %3d%%mana %3d%%mv\n\r",
							buf2,
							(gch->max_hit == 0) ? 0 : (gch->hit * 100) / gch->max_hit,
							(gch->max_mana == 0) ? 0 : (gch->mana * 100) / gch->max_mana,
							(gch->max_move == 0) ? 0 : (gch->move * 100) / gch->max_move);
				}

				send_to_char(buffer.c_str(), ch);
			}
		}

		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->master != nullptr || (ch->leader != nullptr && ch->leader != ch))
	{
		send_to_char("But you are following someone else!\n\r", ch);
		return;
	}

	if (victim->master != ch && ch != victim)
	{
		act_new("$N isn't following you.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);
		return;
	}

	if (is_affected_by(victim, AFF_CHARM))
	{
		send_to_char("You can't remove charmed followers from your group.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_CHARM))
	{
		act_new("You like your master too much to leave $m!", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
		return;
	}

	if (is_same_group(victim, ch) && ch != victim)
	{
		victim->leader = nullptr;
		act_new("$n removes $N from $s group.", ch, nullptr, victim, TO_NOTVICT, POS_RESTING);
		act_new("$n removes you from $s group.", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
		act_new("You remove $N from your group.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);
		check_leadership_affect(victim);
		return;
	}

	victim->leader = ch;
	act_new("$N joins $n's group.", ch, nullptr, victim, TO_NOTVICT, POS_RESTING);
	act_new("You join $n's group.", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
	act_new("$N joins your group.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);

	AFFECT_DATA af;
	if (!is_npc(ch) && !is_npc(victim) && ch->Class()->name == "anti-paladin" && ch->pcdata->learned[gsn_traitors_luck] > 1)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_traitors_luck;
		af.owner = ch;
		af.level = ch->level;
		af.duration = -1;
		SET_BIT(af.bitvector, AFF_PERMANENT);
		af.modifier = 0;
		af.location = 0;
		af.pulse_fun = traitor_pulse;
		new_affect_to_char(ch, &af);
	}

	if (!is_npc(ch) && !is_npc(victim) && victim->Class()->name == "anti-paladin" && victim->pcdata->learned[gsn_traitors_luck] > 1)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_traitors_luck;
		af.owner = victim;
		af.level = ch->level;
		af.duration = -1;
		SET_BIT(af.bitvector, AFF_PERMANENT);
		af.modifier = 0;
		af.location = 0;
		af.pulse_fun = traitor_pulse;

		for (auto vch = char_list; vch; vch = vch->next)
		{
			if (vch != ch && is_same_group(vch, ch))
				new_affect_to_char(vch, &af);
		}
	}
}